

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packages.cpp
# Opt level: O0

uint256 * GetPackageHash(vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         *transactions)

{
  bool bVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  back_insert_iterator<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
  bVar4;
  iterator iVar5;
  iterator iVar6;
  uint256 *in_RDI;
  long in_FS_OFFSET;
  transaction_identifier<true> *wtxid;
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> *__range1;
  iterator __end1;
  iterator __begin1;
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> wtxids_copy;
  HashWriter hashwriter;
  HashWriter *in_stack_fffffffffffffec8;
  transaction_identifier<true> *in_stack_fffffffffffffed0;
  HashWriter *this;
  HashWriter local_88;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::vector
            ((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> *
             )in_stack_fffffffffffffec8);
  cVar2 = std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::cbegin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    *)in_stack_fffffffffffffed0);
  cVar3 = std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::cend((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)in_stack_fffffffffffffed0);
  bVar4 = std::
          back_inserter<std::vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>>>
                    ((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                      *)in_stack_fffffffffffffed0);
  std::
  transform<__gnu_cxx::__normal_iterator<std::shared_ptr<CTransaction_const>const*,std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>>,std::back_insert_iterator<std::vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>>>,GetPackageHash(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::__0>
            (cVar2._M_current,cVar3._M_current,bVar4.container);
  this = &local_88;
  iVar5 = std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
          ::begin((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                   *)in_stack_fffffffffffffed0);
  iVar6 = std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
          ::end((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                 *)in_stack_fffffffffffffed0);
  std::
  sort<__gnu_cxx::__normal_iterator<transaction_identifier<true>*,std::vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>>>,GetPackageHash(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::__1>
            (iVar5._M_current,iVar6._M_current);
  HashWriter::HashWriter(in_stack_fffffffffffffec8);
  std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::begin
            ((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> *
             )in_stack_fffffffffffffed0);
  std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::end
            ((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> *
             )in_stack_fffffffffffffed0);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<transaction_identifier<true>_*,_std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                      ((__normal_iterator<transaction_identifier<true>_*,_std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                        *)this,(__normal_iterator<transaction_identifier<true>_*,_std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                                *)in_stack_fffffffffffffed0);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<transaction_identifier<true>_*,_std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
    ::operator*((__normal_iterator<transaction_identifier<true>_*,_std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                 *)in_stack_fffffffffffffec8);
    HashWriter::operator<<(this,in_stack_fffffffffffffed0);
    __gnu_cxx::
    __normal_iterator<transaction_identifier<true>_*,_std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
    ::operator++((__normal_iterator<transaction_identifier<true>_*,_std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                  *)in_stack_fffffffffffffec8);
  }
  HashWriter::GetSHA256(this);
  std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::~vector
            ((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> *
             )this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

uint256 GetPackageHash(const std::vector<CTransactionRef>& transactions)
{
    // Create a vector of the wtxids.
    std::vector<Wtxid> wtxids_copy;
    std::transform(transactions.cbegin(), transactions.cend(), std::back_inserter(wtxids_copy),
        [](const auto& tx){ return tx->GetWitnessHash(); });

    // Sort in ascending order
    std::sort(wtxids_copy.begin(), wtxids_copy.end(), [](const auto& lhs, const auto& rhs) {
        return std::lexicographical_compare(std::make_reverse_iterator(lhs.end()), std::make_reverse_iterator(lhs.begin()),
                                            std::make_reverse_iterator(rhs.end()), std::make_reverse_iterator(rhs.begin()));
    });

    // Get sha256 hash of the wtxids concatenated in this order
    HashWriter hashwriter;
    for (const auto& wtxid : wtxids_copy) {
        hashwriter << wtxid;
    }
    return hashwriter.GetSHA256();
}